

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::do_replacements(StringPairList *replacements,string *str)

{
  pointer ppVar1;
  ulong uVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  pointer ppVar3;
  
  ppVar1 = (replacements->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (replacements->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    if ((ppVar3->second)._M_string_length < (ppVar3->first)._M_string_length) {
      while (uVar2 = std::__cxx11::string::find((string *)str,(ulong)ppVar3),
            uVar2 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)str,uVar2,(string *)(ppVar3->first)._M_string_length);
      }
    }
  }
  return;
}

Assistant:

void do_replacements(const StringPairList& replacements, std::string& str)
	{
		for (auto&& p : replacements) {
			if (p.first.size() <= p.second.size()) {
				// On gcc, "type_name<std::string>()" is "std::string"
				continue;
			}

			size_t it;
			while ((it=str.find(p.first)) != std::string::npos) {
				str.replace(it, p.first.size(), p.second);
			}
		}
	}